

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExeCommander.cpp
# Opt level: O2

void __thiscall ExeCommander::initCommands(ExeCommander *this)

{
  Command *pCVar1;
  ConvertAddrCommand *pCVar2;
  FetchCommand *pFVar3;
  allocator<char> local_5a;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"info",&local_59);
  pCVar1 = (Command *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"Exe Info",&local_5a);
  ExeInfoCommand::ExeInfoCommand((ExeInfoCommand *)pCVar1,&local_58);
  Commander::addCommand(&this->super_Commander,&local_38,pCVar1,true);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"r-v",&local_59);
  pCVar2 = (ConvertAddrCommand *)operator_new(0x30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Convert: RAW -> RVA",&local_5a);
  ConvertAddrCommand::ConvertAddrCommand(pCVar2,RAW,RVA,&local_58);
  Commander::addCommand(&this->super_Commander,&local_38,(Command *)pCVar2,true);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"v-r",&local_59);
  pCVar2 = (ConvertAddrCommand *)operator_new(0x30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Convert: RVA -> RAW",&local_5a);
  ConvertAddrCommand::ConvertAddrCommand(pCVar2,RVA,RAW,&local_58);
  Commander::addCommand(&this->super_Commander,&local_38,(Command *)pCVar2,true);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"printc",&local_59);
  pFVar3 = (FetchCommand *)operator_new(0x30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Print content by Raw address",&local_5a);
  FetchCommand::FetchCommand(pFVar3,false,RAW,&local_58);
  Commander::addCommand(&this->super_Commander,&local_38,(Command *)pFVar3,true);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"printx",&local_59);
  pFVar3 = (FetchCommand *)operator_new(0x30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Print content by Raw address - HEX",&local_5a);
  FetchCommand::FetchCommand(pFVar3,true,RAW,&local_58);
  Commander::addCommand(&this->super_Commander,&local_38,(Command *)pFVar3,true);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"cl",&local_59);
  pCVar1 = (Command *)operator_new(0x30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Clear chosen wrapper Content",&local_5a);
  ClearWrapperCommand::ClearWrapperCommand
            ((ClearWrapperCommand *)pCVar1,&local_58,0xffffffffffffffff);
  Commander::addCommand(&this->super_Commander,&local_38,pCVar1,true);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"fdump",&local_59);
  pCVar1 = (Command *)operator_new(0x30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Dump chosen wrapper Content into a file",&local_5a);
  DumpWrapperToFileCommand::DumpWrapperToFileCommand
            ((DumpWrapperToFileCommand *)pCVar1,&local_58,0xffffffffffffffff);
  Commander::addCommand(&this->super_Commander,&local_38,pCVar1,true);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"winfo",&local_59);
  pCVar1 = (Command *)operator_new(0x30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Dump chosen wrapper info",&local_5a);
  DumpWrapperCommand::DumpWrapperCommand((DumpWrapperCommand *)pCVar1,&local_58,0xffffffffffffffff);
  Commander::addCommand(&this->super_Commander,&local_38,pCVar1,true);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"einfo",&local_59);
  pCVar1 = (Command *)operator_new(0x30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Dump wrapper entries",&local_5a);
  DumpWrapperEntriesCommand::DumpWrapperEntriesCommand
            ((DumpWrapperEntriesCommand *)pCVar1,&local_58,0xffffffffffffffff);
  Commander::addCommand(&this->super_Commander,&local_38,pCVar1,true);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"e_add",&local_59);
  pCVar1 = (Command *)operator_new(0x30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Add entry to a wrapper",&local_5a);
  AddEntryCommand::AddEntryCommand((AddEntryCommand *)pCVar1,&local_58,0xffffffffffffffff);
  Commander::addCommand(&this->super_Commander,&local_38,pCVar1,true);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"save",&local_59);
  pCVar1 = (Command *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Save exe to file",&local_5a);
  SaveExeToFileCommand::SaveExeToFileCommand((SaveExeToFileCommand *)pCVar1,&local_58);
  Commander::addCommand(&this->super_Commander,&local_38,pCVar1,true);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void ExeCommander::initCommands()
{
    this->addCommand("info", new ExeInfoCommand());

    this->addCommand("r-v", new ConvertAddrCommand(Executable::RAW, Executable::RVA, "Convert: RAW -> RVA"));
    this->addCommand("v-r", new ConvertAddrCommand(Executable::RVA, Executable::RAW, "Convert: RVA -> RAW"));

    this->addCommand("printc", new FetchCommand(false, Executable::RAW, "Print content by Raw address"));
    //this->addCommand("cV", new FetchCommand(false, Executable::RVA, "Fetch content by Virtual address"));

    this->addCommand("printx", new FetchCommand(true, Executable::RAW, "Print content by Raw address - HEX"));
    //this->addCommand("hV", new FetchCommand(true, Executable::RVA, "Fetch content by Virtual address - HEX"));

    this->addCommand("cl", new ClearWrapperCommand("Clear chosen wrapper Content"));
    this->addCommand("fdump", new DumpWrapperToFileCommand("Dump chosen wrapper Content into a file"));
    this->addCommand("winfo", new DumpWrapperCommand("Dump chosen wrapper info"));
    this->addCommand("einfo", new DumpWrapperEntriesCommand("Dump wrapper entries"));

    this->addCommand("e_add", new AddEntryCommand("Add entry to a wrapper"));
    this->addCommand("save", new SaveExeToFileCommand());
}